

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPrimal.cpp
# Opt level: O3

void __thiscall HPrimal::primalRebuild(HPrimal *this)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  __time_t _Var4;
  __suseconds_t _Var5;
  uint uVar6;
  HModel *pHVar7;
  timeval tv;
  timeval local_38;
  
  HModel::recordPivots(this->model,-1,-1,0.0);
  pHVar7 = this->model;
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  _Var5 = local_38.tv_usec;
  _Var4 = local_38.tv_sec;
  dVar1 = (pHVar7->timer).startTime;
  uVar3 = this->invertHint;
  this->invertHint = 0;
  pHVar7 = this->model;
  if (((uVar3 != 3 | pHVar7->InvertIfRowOutNeg) == 1) && (0 < pHVar7->countUpdate)) {
    HModel::computeFactor(pHVar7);
    this->countUpdate = 0;
    pHVar7 = this->model;
  }
  HModel::computeDual(pHVar7);
  HModel::computePrimal(this->model);
  HModel::computeDuObj(this->model,2);
  HModel::util_reportNumberIterationObjectiveValue(this->model);
  pHVar7 = this->model;
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  dVar2 = (pHVar7->timer).startTime;
  uVar6 = this->totalRebuilds + 1;
  this->totalRebuilds = uVar6;
  this->totalRebuildTime =
       this->totalRebuildTime +
       (((double)local_38.tv_usec / 1000000.0 + (double)local_38.tv_sec) - dVar2) +
       (dVar1 - ((double)_Var4 + (double)_Var5 / 1000000.0));
  printf("Primal     rebuild %d (%1d) on iteration %9d: Rebuild time = %g; Total rebuild time %g\n",
         (ulong)uVar6,(ulong)uVar3,(ulong)(uint)this->model->numberIteration);
  this->model->mlFg_haveFreshRebuild = 1;
  return;
}

Assistant:

void HPrimal::primalRebuild() {
    model->recordPivots(-1, -1, 0); // Indicate REINVERT
#ifdef JAJH_dev
    //    double tt0 = model->timer.getTime();
#endif
    double tt0 = model->timer.getTime();

    // Rebuild model->factor - only if we got updates
    int sv_invertHint = invertHint;
    invertHint = invertHint_no; // Was 0
    // Possibly Rebuild model->factor
    bool reInvert = model->countUpdate > 0;
    if (!model->InvertIfRowOutNeg) {
      // Don't reinvert if rowOut is negative [equivalently, if sv_invertHint == invertHint_possiblyOptimal]
      if (sv_invertHint == invertHint_possiblyOptimal) {
	assert(columnIn == -1);
	reInvert = false;
      }
    }
    if (reInvert) {
        model->computeFactor();
        countUpdate = 0;
    }
    model->computeDual();
    model->computePrimal();
    model->computeDuObj();
    model->util_reportNumberIterationObjectiveValue();

    double rebuildTime = model->timer.getTime()-tt0;
    totalRebuilds++;
    totalRebuildTime += rebuildTime;
#ifdef JAJH_dev
    printf("Primal     rebuild %d (%1d) on iteration %9d: Rebuild time = %g; Total rebuild time %g\n",
	   totalRebuilds, sv_invertHint, model->numberIteration, rebuildTime, totalRebuildTime);
#endif
    //Data are fresh from rebuild
    model->mlFg_haveFreshRebuild = 1;
}